

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O3

void __thiscall
cnn::Min::forward_impl
          (Min *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx)

{
  uint uVar1;
  pointer ppTVar2;
  Tensor *pTVar3;
  Tensor *pTVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  int iVar8;
  uint uVar9;
  Index dstRows;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  int iVar18;
  float fVar19;
  Packet4f res;
  undefined1 auVar20 [16];
  Tensor t;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  ulong uStack_40;
  uint local_38;
  void *local_30;
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> local_28;
  
  uVar11 = (ulong)(fx->d).nd;
  iVar13 = 1;
  iVar16 = 1;
  if (uVar11 != 0) {
    uVar10 = 0;
    do {
      iVar16 = iVar16 * (fx->d).d[uVar10];
      uVar10 = uVar10 + 1;
    } while (uVar11 != uVar10);
  }
  ppTVar2 = (xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  pTVar3 = *ppTVar2;
  uVar11 = (ulong)(pTVar3->d).nd;
  if (uVar11 != 0) {
    iVar13 = 1;
    uVar10 = 0;
    do {
      iVar13 = iVar13 * (pTVar3->d).d[uVar10];
      uVar10 = uVar10 + 1;
    } while (uVar11 != uVar10);
  }
  pTVar4 = ppTVar2[1];
  uVar11 = (ulong)(pTVar4->d).nd;
  iVar18 = 1;
  iVar8 = 1;
  if (uVar11 != 0) {
    iVar8 = 1;
    uVar10 = 0;
    do {
      iVar8 = iVar8 * (pTVar4->d).d[uVar10];
      uVar10 = uVar10 + 1;
    } while (uVar11 != uVar10);
  }
  uVar1 = (fx->d).bd;
  pfVar5 = fx->v;
  pfVar6 = pTVar3->v;
  uVar14 = iVar13 * (pTVar3->d).bd;
  pfVar7 = pTVar4->v;
  uVar9 = iVar8 * (pTVar4->d).bd;
  uVar10 = (ulong)uVar9;
  local_30 = (this->super_Node).aux_mem;
  uStack_40 = *(ulong *)((fx->d).d + 6);
  local_48 = *(undefined8 *)((fx->d).d + 4);
  local_38 = (fx->d).bd;
  local_58 = *(undefined8 *)(fx->d).d;
  uStack_50 = *(undefined8 *)((fx->d).d + 2);
  local_28.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar11 = uStack_40 >> 0x20;
  if (uVar11 != 0) {
    iVar18 = 1;
    uVar12 = 0;
    do {
      iVar18 = iVar18 * *(int *)((long)&local_58 + uVar12 * 4);
      uVar12 = uVar12 + 1;
    } while (uVar11 != uVar12);
  }
  if (uVar14 == uVar9) {
    if (iVar18 * local_38 == uVar14) {
      if (uVar14 != 0) {
        uVar11 = 0;
        do {
          *(uint *)((long)local_30 + uVar11 * 4) =
               -(uint)(pfVar6[uVar11] < pfVar7[uVar11]) & 0x3f800000;
          uVar11 = uVar11 + 1;
        } while (uVar10 != uVar11);
      }
      if (iVar16 * uVar1 == uVar14) {
        uVar11 = uVar10;
        if ((((ulong)pfVar5 & 3) == 0) &&
           (uVar11 = (ulong)(-((uint)((ulong)pfVar5 >> 2) & 0x3fffffff) & 3), uVar10 <= uVar11)) {
          uVar11 = uVar10;
        }
        uVar15 = uVar10 - uVar11;
        uVar12 = uVar15 + 3;
        if (-1 < (long)uVar15) {
          uVar12 = uVar15;
        }
        if (uVar11 != 0) {
          uVar17 = 0;
          do {
            fVar19 = pfVar7[uVar17];
            if (pfVar6[uVar17] <= pfVar7[uVar17]) {
              fVar19 = pfVar6[uVar17];
            }
            pfVar5[uVar17] = fVar19;
            uVar17 = uVar17 + 1;
          } while (uVar11 != uVar17);
        }
        uVar12 = (uVar12 & 0xfffffffffffffffc) + uVar11;
        if (3 < (long)uVar15) {
          do {
            auVar20 = minps(*(undefined1 (*) [16])(pfVar7 + uVar11),
                            *(undefined1 (*) [16])(pfVar6 + uVar11));
            *(undefined1 (*) [16])(pfVar5 + uVar11) = auVar20;
            uVar11 = uVar11 + 4;
          } while ((long)uVar11 < (long)uVar12);
        }
        if ((long)uVar12 < (long)uVar10) {
          do {
            fVar19 = pfVar7[uVar12];
            if (pfVar6[uVar12] <= pfVar7[uVar12]) {
              fVar19 = pfVar6[uVar12];
            }
            pfVar5[uVar12] = fVar19;
            uVar12 = uVar12 + 1;
          } while (uVar10 != uVar12);
        }
        std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::~vector(&local_28);
        return;
      }
    }
    __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                  "void Eigen::DenseBase<Eigen::Map<Eigen::Matrix<float, -1, 1>>>::resize(Index, Index) [Derived = Eigen::Map<Eigen::Matrix<float, -1, 1>>]"
                 );
  }
  __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                "Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<float, float, Eigen::internal::cmp_LT>, const Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float, -1, 1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_cmp_op<float, float, Eigen::internal::cmp_LT>, Lhs = const Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float, -1, 1>>>, Rhs = const Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float, -1, 1>>>]"
               );
}

Assistant:

void Min::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
#ifdef HAVE_CUDA
  throw std::runtime_error("Min not yet implemented for CUDA");
#else
  auto y = fx.vec();
  auto x1 = xs[0]->vec();
  auto x2 = xs[1]->vec();
  Tensor t(fx.d, static_cast<float*>(aux_mem));
  auto u = t.vec();
  u = (x1.array() < x2.array()).matrix().cast<float>();
  y = x1.cwiseMin(x2);
#endif
}